

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_get_reference_point.cc
# Opt level: O0

bool s2shapeutil::GetReferencePointAtVertex(S2Shape *shape,S2Point *vtest,ReferencePoint *result)

{
  bool bVar1;
  int iVar2;
  undefined1 local_a0 [4];
  int contains_sign;
  Edge edge;
  int e;
  undefined1 local_58 [4];
  int n;
  S2ContainsVertexQuery contains_query;
  ReferencePoint *result_local;
  S2Point *vtest_local;
  S2Shape *shape_local;
  
  contains_query.edge_map_.
  super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .
  super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
  .tree_.size_ = (size_type)result;
  S2ContainsVertexQuery::S2ContainsVertexQuery((S2ContainsVertexQuery *)local_58,vtest);
  iVar2 = (*shape->_vptr_S2Shape[2])();
  for (edge.v1.c_[2]._0_4_ = 0; (int)edge.v1.c_[2]._0_4_ < iVar2;
      edge.v1.c_[2]._0_4_ = edge.v1.c_[2]._0_4_ + 1) {
    (*shape->_vptr_S2Shape[3])(local_a0,shape,(ulong)edge.v1.c_[2]._0_4_);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)local_a0,vtest);
    if (bVar1) {
      S2ContainsVertexQuery::AddEdge
                ((S2ContainsVertexQuery *)local_58,(S2Point *)(edge.v0.c_ + 2),1);
    }
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)(edge.v0.c_ + 2),vtest);
    if (bVar1) {
      S2ContainsVertexQuery::AddEdge((S2ContainsVertexQuery *)local_58,(S2Point *)local_a0,-1);
    }
  }
  iVar2 = S2ContainsVertexQuery::ContainsSign((S2ContainsVertexQuery *)local_58);
  if (iVar2 != 0) {
    *(VType *)contains_query.edge_map_.
              super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
              .
              super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
              .
              super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
              .tree_.size_ = vtest->c_[0];
    *(VType *)(contains_query.edge_map_.
               super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
               .
               super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
               .
               super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
               .tree_.size_ + 8) = vtest->c_[1];
    *(VType *)(contains_query.edge_map_.
               super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
               .
               super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
               .
               super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
               .tree_.size_ + 0x10) = vtest->c_[2];
    *(bool *)(contains_query.edge_map_.
              super_btree_map_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
              .
              super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
              .
              super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<Vector3<double>,_int,_std::less<Vector3<double>_>,_std::allocator<std::pair<const_Vector3<double>,_int>_>,_256,_false>_>_>
              .tree_.size_ + 0x18) = 0 < iVar2;
  }
  S2ContainsVertexQuery::~S2ContainsVertexQuery((S2ContainsVertexQuery *)local_58);
  return iVar2 != 0;
}

Assistant:

static bool GetReferencePointAtVertex(
    const S2Shape& shape, const S2Point& vtest, ReferencePoint* result) {
  // Let P be an unbalanced vertex.  Vertex P is defined to be inside the
  // region if the region contains a particular direction vector starting from
  // P, namely the direction S2::Ortho(P).  This can be calculated using
  // S2ContainsVertexQuery.
  S2ContainsVertexQuery contains_query(vtest);
  int n = shape.num_edges();
  for (int e = 0; e < n; ++e) {
    auto edge = shape.edge(e);
    if (edge.v0 == vtest) contains_query.AddEdge(edge.v1, 1);
    if (edge.v1 == vtest) contains_query.AddEdge(edge.v0, -1);
  }
  int contains_sign = contains_query.ContainsSign();
  if (contains_sign == 0) {
    return false;  // There are no unmatched edges incident to this vertex.
  }
  result->point = vtest;
  result->contained = contains_sign > 0;
  return true;
}